

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmAssignment(ExpressionContext *ctx,VmModule *module,ExprAssignment *node)

{
  SynBase *source;
  bool bVar1;
  TypeBase *pTVar2;
  VmInstruction *dst;
  VmInstruction *value;
  VmConstant *pVVar3;
  VmInstruction *pVVar4;
  VmInstruction *pVVar5;
  VmInstruction *instInit;
  uint srcOffset;
  TypeArray *typeArray;
  ulong uVar6;
  uint in_stack_ffffffffffffffa8;
  
  pTVar2 = node->lhs->type;
  if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x12)) {
    pTVar2 = (TypeBase *)0x0;
  }
  if (pTVar2 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xca7,
                  "VmValue *CompileVmAssignment(ExpressionContext &, VmModule *, ExprAssignment *)")
    ;
  }
  if ((TypeBase *)pTVar2[1]._vptr_TypeBase != node->rhs->type) {
    __assert_fail("refType->subType == node->rhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xca8,
                  "VmValue *CompileVmAssignment(ExpressionContext &, VmModule *, ExprAssignment *)")
    ;
  }
  dst = (VmInstruction *)CompileVm(ctx,module,node->lhs);
  value = (VmInstruction *)CompileVm(ctx,module,node->rhs);
  if ((value == (VmInstruction *)0x0) || (instInit = value, (value->super_VmValue).typeID != 2)) {
    instInit = (VmInstruction *)0x0;
  }
  bVar1 = true;
  pVVar5 = dst;
  if ((instInit != (VmInstruction *)0x0) && (instInit->cmd == VM_INST_ARRAY)) {
    typeArray = (TypeArray *)(node->super_ExprBase).type;
    if ((typeArray == (TypeArray *)0x0) || ((typeArray->super_TypeBase).typeID != 0x13)) {
      typeArray = (TypeArray *)0x0;
    }
    pTVar2 = typeArray->subType;
    bVar1 = IsGoodConstantArray(ctx,module,instInit);
    source = (node->super_ExprBase).source;
    if (bVar1) {
      pVVar3 = GetConstantArrayValue(ctx,source,typeArray,instInit);
      anon_unknown.dwarf_233176::CreateStore
                (ctx,module,(node->super_ExprBase).source,&typeArray->super_TypeBase,(VmValue *)dst,
                 &pVVar3->super_VmValue,0);
      srcOffset = (uint)pVVar3;
    }
    else {
      pVVar3 = anon_unknown.dwarf_233176::CreateAlloca
                         (ctx,module,source,node->rhs->type,"array",true);
      if ((instInit->arguments).count != 0) {
        uVar6 = 0;
        do {
          pVVar5 = (VmInstruction *)(instInit->arguments).data[uVar6];
          if ((pVVar5 == (VmInstruction *)0x0) ||
             (pVVar4 = pVVar5, (pVVar5->super_VmValue).typeID != 2)) {
            pVVar4 = (VmInstruction *)0x0;
          }
          if (pVVar4 == (VmInstruction *)0x0) {
LAB_00284274:
            in_stack_ffffffffffffffa8 = (int)pTVar2->size * (int)uVar6;
            anon_unknown.dwarf_233176::CreateStore
                      (ctx,module,(node->super_ExprBase).source,pTVar2,&pVVar3->super_VmValue,
                       &pVVar5->super_VmValue,in_stack_ffffffffffffffa8);
          }
          else {
            if (pVVar4->cmd == VM_INST_DOUBLE_TO_FLOAT) {
              if ((pVVar4->arguments).count == 0) {
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x199,
                              "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                             );
              }
              pVVar5 = (VmInstruction *)*(pVVar4->arguments).data;
            }
            if (pVVar4->parent != module->currentBlock) goto LAB_00284274;
            module->currentBlock->insertPoint = pVVar4;
            in_stack_ffffffffffffffa8 = (int)pTVar2->size * (int)uVar6;
            anon_unknown.dwarf_233176::CreateStore
                      (ctx,module,(node->super_ExprBase).source,pTVar2,&pVVar3->super_VmValue,
                       &pVVar5->super_VmValue,in_stack_ffffffffffffffa8);
            module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (instInit->arguments).count);
      }
      srcOffset = (uint)(typeArray->super_TypeBase).size;
      anon_unknown.dwarf_233176::CreateMemCopy
                (module,(node->super_ExprBase).source,(VmValue *)dst,0,&pVVar3->super_VmValue,
                 srcOffset,in_stack_ffffffffffffffa8);
    }
    pVVar5 = (VmInstruction *)
             anon_unknown.dwarf_233176::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,node->rhs->type,(VmValue *)dst,
                        srcOffset);
    anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,(VmValue *)pVVar5);
    bVar1 = false;
  }
  if (bVar1) {
    anon_unknown.dwarf_233176::CreateStore
              (ctx,module,(node->super_ExprBase).source,node->rhs->type,(VmValue *)dst,
               (VmValue *)value,0);
    anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,(VmValue *)value);
    pVVar5 = value;
  }
  return &pVVar5->super_VmValue;
}

Assistant:

VmValue* CompileVmAssignment(ExpressionContext &ctx, VmModule *module, ExprAssignment *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	(void)refType;
	assert(refType);
	assert(refType->subType == node->rhs->type);

	VmValue *address = CompileVm(ctx, module, node->lhs);

	VmValue *initializer = CompileVm(ctx, module, node->rhs);

	if(VmInstruction *instInit = getType<VmInstruction>(initializer))
	{
		// Array initializers are compiled to per-element assignments
		if(instInit->cmd == VM_INST_ARRAY)
		{
			TypeArray *typeArray = getType<TypeArray>(node->type);

			TypeBase *elementType = typeArray->subType;

			if(IsGoodConstantArray(ctx, module, instInit))
			{
				VmValue *constant = GetConstantArrayValue(ctx, node->source, typeArray, instInit);

				CreateStore(ctx, module, node->source, typeArray, address, constant, 0);

				VmValue *copy = CreateLoad(ctx, module, node->source, node->rhs->type, address, 0);

				return CheckType(ctx, node, copy);
			}

			VmConstant *tempAddress = CreateAlloca(ctx, module, node->source, node->rhs->type, "array", true);

			for(unsigned i = 0; i < instInit->arguments.size(); i++)
			{
				VmValue *element = instInit->arguments[i];

				VmInstruction *elementInst = getType<VmInstruction>(element);

				if(elementInst)
				{
					if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
						element = elementInst->arguments[0];

					if(elementInst->parent == module->currentBlock)
					{
						module->currentBlock->insertPoint = elementInst;

						CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));

						module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
					}
					else
					{
						CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));
					}
				}
				else
				{
					CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));
				}
			}

			CreateMemCopy(module, node->source, address, 0, tempAddress, 0, int(typeArray->size));

			VmValue *copy = CreateLoad(ctx, module, node->source, node->rhs->type, address, 0);

			return CheckType(ctx, node, copy);
		}
	}

	CreateStore(ctx, module, node->source, node->rhs->type, address, initializer, 0);

	return CheckType(ctx, node, initializer);
}